

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

OpCode __thiscall
ByteCodeGenerator::GetStSlotOp
          (ByteCodeGenerator *this,Scope *scope,int envIndex,RegSlot scopeLocation,bool chkBlockVar,
          FuncInfo *funcInfo)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  OpCode OVar4;
  OpCode OVar5;
  undefined4 *puVar6;
  uint lineNumber;
  char *pcVar7;
  
  if (envIndex == -1) {
    if (scopeLocation != 0xffffffff) {
      if (funcInfo->frameSlotsRegister == scopeLocation) {
        OVar5 = StLocalSlot;
        if ((scope->scopeType != ScopeType_Parameter) || (scope->func->currentChildScope == scope))
        goto LAB_0081824b;
        OVar5 = StParamSlot;
        if ((funcInfo->field_0xb5 & 0x80) == 0) goto LAB_0081824b;
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        lineNumber = 0x11de;
        OVar5 = StParamSlot;
      }
      else {
        if (funcInfo->frameObjRegister != scopeLocation) goto LAB_008181df;
        OVar5 = StLocalObjSlot;
        if ((scope->scopeType != ScopeType_Parameter) || (scope->func->currentChildScope == scope))
        goto LAB_0081824b;
        OVar5 = StParamObjSlot;
        if ((funcInfo->field_0xb5 & 0x80) == 0) goto LAB_0081824b;
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        lineNumber = 0x11ed;
        OVar5 = StParamObjSlot;
      }
      pcVar7 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
      ;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,lineNumber,"(!funcInfo->IsBodyAndParamScopeMerged())",
                         "!funcInfo->IsBodyAndParamScopeMerged()");
      if (!bVar3) {
LAB_00818270:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
      this = (ByteCodeGenerator *)pcVar7;
      goto LAB_0081824b;
    }
LAB_008181df:
    if (scope->innerScopeIndex == 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      pcVar7 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
      ;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x11f7,"(scope->HasInnerScopeIndex())","scope->HasInnerScopeIndex()");
      if (!bVar3) goto LAB_00818270;
      *puVar6 = 0;
      this = (ByteCodeGenerator *)pcVar7;
    }
    bVar1 = scope->field_0x44;
    OVar4 = StInnerSlot;
    OVar5 = StInnerObjSlot;
  }
  else {
    bVar1 = scope->field_0x44;
    OVar4 = StEnvSlot;
    OVar5 = StEnvObjSlot;
  }
  if ((bVar1 & 2) == 0) {
    OVar5 = OVar4;
  }
LAB_0081824b:
  if (chkBlockVar) {
    OVar5 = ToChkUndeclOp(this,OVar5);
    return OVar5;
  }
  return OVar5;
}

Assistant:

Js::OpCode
ByteCodeGenerator::GetStSlotOp(Scope *scope, int envIndex, Js::RegSlot scopeLocation, bool chkBlockVar, FuncInfo *funcInfo)
{
    Js::OpCode op;

    if (envIndex != -1)
    {
        if (scope->GetIsObject())
        {
            op = Js::OpCode::StEnvObjSlot;
        }
        else
        {
            op = Js::OpCode::StEnvSlot;
        }
    }
    else if (scopeLocation != Js::Constants::NoRegister &&
        scopeLocation == funcInfo->frameSlotsRegister)
    {
        if (scope->GetScopeType() == ScopeType_Parameter && scope != scope->GetFunc()->GetCurrentChildScope())
        {
            // Symbol is from the param scope of a split scope function and we are emitting the body.
            // We should use the param scope's bytecode now.
            Assert(!funcInfo->IsBodyAndParamScopeMerged());
            op = Js::OpCode::StParamSlot;
        }
        else
        {
            op = Js::OpCode::StLocalSlot;
        }
    }
    else if (scopeLocation != Js::Constants::NoRegister &&
        scopeLocation == funcInfo->frameObjRegister)
    {
        if (scope->GetScopeType() == ScopeType_Parameter && scope != scope->GetFunc()->GetCurrentChildScope())
        {
            // Symbol is from the param scope of a split scope function and we are emitting the body.
            // We should use the param scope's bytecode now.
            Assert(!funcInfo->IsBodyAndParamScopeMerged());
            op = Js::OpCode::StParamObjSlot;
        }
        else
        {
            op = Js::OpCode::StLocalObjSlot;
        }
    }
    else
    {
        Assert(scope->HasInnerScopeIndex());
        if (scope->GetIsObject())
        {
            op = Js::OpCode::StInnerObjSlot;
        }
        else
        {
            op = Js::OpCode::StInnerSlot;
        }
    }

    if (chkBlockVar)
    {
        op = this->ToChkUndeclOp(op);
    }

    return op;
}